

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O1

void __thiscall
bloaty::RangeMapTest_AddRange_Test::RangeMapTest_AddRange_Test(RangeMapTest_AddRange_Test *this)

{
  _Rb_tree_header *p_Var1;
  
  testing::Test::Test((Test *)this);
  p_Var1 = &(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&(this->super_RangeMapTest).kNoTranslation = 0xffffffff;
  *(undefined4 *)((long)&(this->super_RangeMapTest).kNoTranslation + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_RangeMapTest).kUnknownSize = 0xffffffff;
  *(undefined4 *)((long)&(this->super_RangeMapTest).kUnknownSize + 4) = 0xffffffff;
  (this->super_RangeMapTest).super_Test._vptr_Test = (_func_int **)&PTR__RangeMapTest_0062b760;
  return;
}

Assistant:

TEST_F(RangeMapTest, AddRange) {
  CheckConsistency();
  AssertMainMapEquals({});

  map_.AddRange(4, 3, "foo");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"}
  });

  map_.AddRange(30, 5, "bar");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {30, 35, kNoTranslation, "bar"}
  });

  map_.AddRange(50, 0, "baz");  // No-op due to 0 size.
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {30, 35, kNoTranslation, "bar"}
  });

  map_.AddRange(20, 5, "baz");
  map_.AddRange(25, 5, "baz2");
  map_.AddRange(40, 5, "quux");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {20, 25, kNoTranslation, "baz"},
    {25, 30, kNoTranslation, "baz2"},
    {30, 35, kNoTranslation, "bar"},
    {40, 45, kNoTranslation, "quux"}
  });

  map_.AddRange(21, 25, "overlapping");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {20, 25, kNoTranslation, "baz"},
    {25, 30, kNoTranslation, "baz2"},
    {30, 35, kNoTranslation, "bar"},
    {35, 40, kNoTranslation, "overlapping"},
    {40, 45, kNoTranslation, "quux"},
    {45, 46, kNoTranslation, "overlapping"}
  });

  map_.AddRange(21, 25, "overlapping no-op");
  CheckConsistency();
  AssertMainMapEquals({
    {4, 7, kNoTranslation, "foo"},
    {20, 25, kNoTranslation, "baz"},
    {25, 30, kNoTranslation, "baz2"},
    {30, 35, kNoTranslation, "bar"},
    {35, 40, kNoTranslation, "overlapping"},
    {40, 45, kNoTranslation, "quux"},
    {45, 46, kNoTranslation, "overlapping"}
  });

  map_.AddRange(0, 100, "overlap everything");
  CheckConsistency();
  AssertMainMapEquals({
    {0, 4, kNoTranslation, "overlap everything"},
    {4, 7, kNoTranslation, "foo"},
    {7, 20, kNoTranslation, "overlap everything"},
    {20, 25, kNoTranslation, "baz"},
    {25, 30, kNoTranslation, "baz2"},
    {30, 35, kNoTranslation, "bar"},
    {35, 40, kNoTranslation, "overlapping"},
    {40, 45, kNoTranslation, "quux"},
    {45, 46, kNoTranslation, "overlapping"},
    {46, 100, kNoTranslation, "overlap everything"},
  });
}